

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O0

mraa_result_t mraa_intel_edison_mmap_setup(mraa_gpio_context dev,mraa_boolean_t en)

{
  int iVar1;
  undefined1 local_b0 [8];
  stat fd_stat;
  mraa_boolean_t en_local;
  mraa_gpio_context dev_local;
  
  fd_stat.__glibc_reserved[2]._4_4_ = en;
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"edison mmap: context not valid");
    dev_local._4_4_ = MRAA_ERROR_INVALID_HANDLE;
  }
  else if (en == 0) {
    if ((dev->mmap_write == (_func_mraa_result_t_mraa_gpio_context_int *)0x0) &&
       (dev->mmap_read == (_func_int_mraa_gpio_context *)0x0)) {
      syslog(3,"edison mmap: can\'t disable disabled mmap gpio");
      dev_local._4_4_ = MRAA_ERROR_INVALID_PARAMETER;
    }
    else {
      dev->mmap_write = (_func_mraa_result_t_mraa_gpio_context_int *)0x0;
      dev->mmap_read = (_func_int_mraa_gpio_context *)0x0;
      mmap_count = mmap_count - 1;
      if (mmap_count == 0) {
        dev_local._4_4_ = mraa_intel_edison_mmap_unsetup();
      }
      else {
        dev_local._4_4_ = MRAA_SUCCESS;
      }
    }
  }
  else if ((dev->mmap_write == (_func_mraa_result_t_mraa_gpio_context_int *)0x0) ||
          (dev->mmap_read == (_func_int_mraa_gpio_context *)0x0)) {
    if (mmap_reg == (uint8_t *)0x0) {
      mmap_fd = open("/sys/devices/pci0000:00/0000:00:0c.0/resource0",2);
      if (mmap_fd < 0) {
        syslog(3,"edison map: unable to open resource0 file");
        return MRAA_ERROR_INVALID_HANDLE;
      }
      iVar1 = fstat(mmap_fd,(stat *)local_b0);
      if (iVar1 != 0) {
        syslog(3,"edison map: unable to access resource0 file");
        return MRAA_ERROR_INVALID_HANDLE;
      }
      mmap_size = (int)fd_stat.st_rdev;
      mmap_reg = (uint8_t *)mmap((void *)0x0,fd_stat.st_rdev,3,1,mmap_fd,0);
      if (mmap_reg == (uint8_t *)0xffffffffffffffff) {
        syslog(3,"edison mmap: failed to mmap");
        mmap_reg = (uint8_t *)0x0;
        close(mmap_fd);
        return MRAA_ERROR_NO_RESOURCES;
      }
    }
    dev->mmap_write = mraa_intel_edison_mmap_write;
    dev->mmap_read = mraa_intel_edison_mmap_read;
    mmap_count = mmap_count + 1;
    dev_local._4_4_ = MRAA_SUCCESS;
  }
  else {
    syslog(3,"edison mmap: can\'t enable enabled mmap gpio");
    dev_local._4_4_ = MRAA_ERROR_INVALID_PARAMETER;
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_intel_edison_mmap_setup(mraa_gpio_context dev, mraa_boolean_t en)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "edison mmap: context not valid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (en == 0) {
        if (dev->mmap_write == NULL && dev->mmap_read == NULL) {
            syslog(LOG_ERR, "edison mmap: can't disable disabled mmap gpio");
            return MRAA_ERROR_INVALID_PARAMETER;
        }
        dev->mmap_write = NULL;
        dev->mmap_read = NULL;
        mmap_count--;
        if (mmap_count == 0) {
            return mraa_intel_edison_mmap_unsetup();
        }
        return MRAA_SUCCESS;
    }

    if (dev->mmap_write != NULL && dev->mmap_read != NULL) {
        syslog(LOG_ERR, "edison mmap: can't enable enabled mmap gpio");
        return MRAA_ERROR_INVALID_PARAMETER;
    }

    // Might need to make some elements of this thread safe.
    // For example only allow one thread to enter the following block
    // to prevent mmap'ing twice.
    if (mmap_reg == NULL) {
        if ((mmap_fd = open(MMAP_PATH, O_RDWR)) < 0) {
            syslog(LOG_ERR, "edison map: unable to open resource0 file");
            return MRAA_ERROR_INVALID_HANDLE;
        }

        struct stat fd_stat;
        if (fstat(mmap_fd, &fd_stat) != 0) {
            syslog(LOG_ERR, "edison map: unable to access resource0 file");
            return MRAA_ERROR_INVALID_HANDLE;
        }
        mmap_size = fd_stat.st_size;

        mmap_reg =
        (uint8_t*) mmap(NULL, fd_stat.st_size, PROT_READ | PROT_WRITE, MAP_FILE | MAP_SHARED, mmap_fd, 0);
        if (mmap_reg == MAP_FAILED) {
            syslog(LOG_ERR, "edison mmap: failed to mmap");
            mmap_reg = NULL;
            close(mmap_fd);
            return MRAA_ERROR_NO_RESOURCES;
        }
    }
    dev->mmap_write = &mraa_intel_edison_mmap_write;
    dev->mmap_read = &mraa_intel_edison_mmap_read;
    mmap_count++;

    return MRAA_SUCCESS;
}